

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelController.cpp
# Opt level: O1

string * __thiscall
cali::ChannelController::name_abi_cxx11_(string *__return_storage_ptr__,ChannelController *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  peVar1 = (this->mP).
           super___shared_ptr<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (peVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (peVar1->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ChannelController::name() const
{
    return mP->name;
}